

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

void __thiscall
glslang::TIntermediate::mergeErrorCheck
          (TIntermediate *this,TInfoSink *infoSink,TIntermSymbol *symbol,TIntermSymbol *unitSymbol)

{
  byte bVar1;
  TTypeParameters *this_00;
  TTypeParameters *rhs;
  undefined8 uVar2;
  TString name;
  TString name_00;
  TString name_01;
  TString name_02;
  TString name_03;
  TString name_04;
  TString name_05;
  TString name_06;
  TString name_07;
  TString name_08;
  TString name_09;
  TString structName;
  TString structName_00;
  TString structName_01;
  TString structName_02;
  TString structName_03;
  TString structName_04;
  TString structName_05;
  TString structName_06;
  TString structName_07;
  TString structName_08;
  TString structName_09;
  bool bVar3;
  bool bVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  undefined4 uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  long *plVar11;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined8 uVar12;
  undefined4 extraout_var_31;
  long lVar13;
  undefined4 extraout_var_32;
  TString *pTVar14;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined8 extraout_RAX;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar15;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  undefined4 extraout_var_50;
  undefined4 extraout_var_51;
  undefined4 extraout_var_52;
  undefined4 extraout_var_53;
  undefined4 extraout_var_54;
  undefined4 extraout_var_55;
  undefined4 extraout_var_56;
  undefined4 extraout_var_57;
  undefined4 extraout_var_58;
  undefined4 extraout_var_59;
  undefined4 extraout_var_60;
  undefined4 extraout_var_61;
  undefined4 extraout_var_62;
  undefined4 extraout_var_63;
  undefined4 extraout_var_64;
  undefined4 extraout_var_65;
  undefined4 extraout_var_66;
  undefined4 extraout_var_67;
  undefined8 extraout_RAX_00;
  undefined4 extraout_var_68;
  undefined4 extraout_var_69;
  undefined4 extraout_var_70;
  undefined4 extraout_var_71;
  undefined4 extraout_var_72;
  undefined4 extraout_var_73;
  undefined4 extraout_var_74;
  undefined4 extraout_var_75;
  undefined4 extraout_var_76;
  undefined4 extraout_var_77;
  undefined4 extraout_var_78;
  undefined4 extraout_var_79;
  undefined4 extraout_var_80;
  undefined4 extraout_var_81;
  undefined4 extraout_var_82;
  undefined4 extraout_var_83;
  undefined4 extraout_var_84;
  undefined4 extraout_var_85;
  undefined4 extraout_var_86;
  undefined4 extraout_var_87;
  undefined4 extraout_var_88;
  undefined4 extraout_var_89;
  undefined4 extraout_var_90;
  undefined4 extraout_var_91;
  undefined4 extraout_var_92;
  undefined4 extraout_var_93;
  undefined4 extraout_var_94;
  undefined4 extraout_var_95;
  undefined4 extraout_var_96;
  undefined4 extraout_var_97;
  undefined4 extraout_var_98;
  undefined4 extraout_var_99;
  undefined4 extraout_var_x00100;
  undefined4 extraout_var_x00101;
  undefined4 extraout_var_x00102;
  undefined4 extraout_var_x00103;
  undefined4 extraout_var_x00104;
  undefined4 extraout_var_x00105;
  undefined4 extraout_var_x00106;
  undefined4 extraout_var_x00107;
  undefined4 extraout_var_x00108;
  undefined4 extraout_var_x00109;
  undefined4 extraout_var_x00110;
  undefined4 extraout_var_x00111;
  undefined4 extraout_var_x00112;
  undefined4 extraout_var_x00113;
  undefined4 extraout_var_x00114;
  undefined4 extraout_var_x00115;
  undefined4 extraout_var_x00116;
  undefined4 extraout_var_x00117;
  undefined4 extraout_var_x00118;
  undefined4 extraout_var_x00119;
  undefined4 extraout_var_x00120;
  undefined4 extraout_var_x00121;
  undefined4 extraout_var_x00122;
  undefined4 extraout_var_x00123;
  undefined4 extraout_var_x00124;
  undefined4 extraout_var_x00125;
  undefined4 extraout_var_x00126;
  undefined4 extraout_var_x00127;
  undefined4 extraout_var_x00128;
  undefined4 extraout_var_x00129;
  TIntermSymbol *pTVar16;
  undefined4 extraout_var_x00131;
  undefined4 extraout_var_x00132;
  TType *pTVar17;
  undefined4 extraout_var_x00134;
  undefined4 extraout_var_x00135;
  undefined4 extraout_var_x00136;
  undefined4 extraout_var_x00137;
  undefined4 extraout_var_x00138;
  undefined4 extraout_var_x00139;
  undefined4 extraout_var_x00140;
  undefined4 extraout_var_x00141;
  undefined4 extraout_var_x00142;
  undefined4 extraout_var_x00143;
  undefined4 extraout_var_x00144;
  undefined4 extraout_var_x00145;
  _func_int **pp_Var18;
  undefined4 extraout_var_x00147;
  undefined4 extraout_var_x00148;
  undefined4 extraout_var_x00149;
  undefined4 extraout_var_x00150;
  undefined4 extraout_var_x00151;
  undefined4 extraout_var_x00152;
  long lVar19;
  char *pcVar20;
  ulong uVar21;
  int iVar22;
  EShLanguage EVar23;
  EShLanguage stage;
  TIntermSymbol *pTVar24;
  TIntermSymbol *pTVar25;
  undefined1 uVar26;
  byte bVar27;
  undefined8 unaff_R12;
  char *__end_1;
  long lVar28;
  undefined1 getQualifiers;
  EShLanguage EVar29;
  char *__end;
  long lVar30;
  ulong uVar31;
  uint uVar32;
  char *__end_4;
  TIntermSymbol *pTVar33;
  uint uVar34;
  bool bVar35;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *pbVar36;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *pbVar37;
  undefined1 in_stack_fffffffffffffb88 [12];
  TIntermSymbol *pTVar38;
  EShLanguage EVar39;
  undefined4 in_stack_fffffffffffffbb4;
  undefined4 in_stack_fffffffffffffbbc;
  undefined4 uVar40;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  uint local_438;
  uint local_434;
  uint local_430;
  uint local_42c;
  TString errmsg;
  pool_allocator<char> local_3f8;
  TPoolAllocator *local_3f0;
  undefined1 *local_3e8;
  undefined1 local_3d8 [16];
  TPoolAllocator *local_3c8;
  undefined1 *local_3c0;
  undefined1 local_3b0 [16];
  TPoolAllocator *local_3a0;
  undefined1 *local_398;
  undefined1 local_388 [16];
  TPoolAllocator *local_378;
  undefined1 *local_370;
  undefined1 local_360 [16];
  TPoolAllocator *local_350;
  undefined1 *local_348;
  undefined1 local_338 [16];
  TPoolAllocator *local_328;
  undefined1 *local_320;
  undefined1 local_310 [16];
  TPoolAllocator *local_300;
  undefined1 *local_2f8;
  undefined1 local_2e8 [16];
  TPoolAllocator *local_2d8;
  undefined1 *local_2d0;
  undefined1 local_2c0 [16];
  TPoolAllocator *local_2b0;
  undefined1 *local_2a8;
  undefined1 local_298 [16];
  TPoolAllocator *local_288;
  undefined1 *local_280;
  undefined1 local_270 [16];
  TPoolAllocator *local_260;
  undefined1 *local_258;
  undefined1 local_248 [16];
  TPoolAllocator *local_238;
  undefined1 *local_230;
  undefined1 local_220 [16];
  TPoolAllocator *local_210;
  undefined1 *local_208;
  undefined1 local_1f8 [16];
  TPoolAllocator *local_1e8;
  undefined1 *local_1e0;
  undefined1 local_1d0 [16];
  TPoolAllocator *local_1c0;
  undefined1 *local_1b8;
  undefined1 local_1a8 [16];
  TPoolAllocator *local_198;
  undefined1 *local_190;
  undefined1 local_180 [16];
  TPoolAllocator *local_170;
  undefined1 *local_168;
  undefined1 local_158 [16];
  TPoolAllocator *local_148;
  undefined1 *local_140;
  undefined1 local_130 [16];
  TPoolAllocator *local_120;
  undefined1 *local_118;
  undefined1 local_108 [16];
  TPoolAllocator *local_f8;
  undefined1 *local_f0;
  undefined1 local_e0 [16];
  TPoolAllocator *local_d0;
  undefined1 *local_c8;
  undefined1 local_b8 [16];
  TPoolAllocator *local_a8;
  undefined1 *local_a0;
  undefined1 local_90 [16];
  TPoolAllocator *local_80;
  undefined1 *local_78;
  undefined1 local_68 [16];
  TPoolAllocator *local_58;
  undefined1 *local_50;
  undefined1 local_40 [16];
  undefined4 extraout_var_21;
  undefined4 extraout_var_x00130;
  undefined4 extraout_var_x00133;
  undefined4 extraout_var_x00146;
  
  EVar23 = symbol->stage;
  EVar39 = unitSymbol->stage;
  iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
  bVar3 = isIoResizeArray((TType *)CONCAT44(extraout_var,iVar7),EVar23);
  EVar29 = EVar39;
  pTVar38 = unitSymbol;
  stage = EVar23;
  pTVar24 = symbol;
  if (bVar3) {
LAB_00368968:
    iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    bVar3 = isIoResizeArray((TType *)CONCAT44(extraout_var_01,iVar7),EVar23);
    iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])(symbol);
    iVar22 = 0;
    uVar32 = 0;
    if (CONCAT44(extraout_var_02,iVar7) != 0) {
      iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])();
      lVar30 = *(long *)(CONCAT44(extraout_var_03,iVar7) + 8);
      uVar32 = 0;
      if (lVar30 != 0) {
        uVar32 = (uint)((ulong)(*(long *)(lVar30 + 0x10) - *(long *)(lVar30 + 8)) >> 4);
      }
    }
    pTVar33 = pTVar38;
    iVar7 = (*(pTVar38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar38);
    bVar4 = isIoResizeArray((TType *)CONCAT44(extraout_var_04,iVar7),EVar29);
    iVar7 = (*(pTVar38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])(pTVar38);
    if (CONCAT44(extraout_var_05,iVar7) != 0) {
      iVar7 = (*(pTVar38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])(pTVar38);
      lVar30 = *(long *)(CONCAT44(extraout_var_06,iVar7) + 8);
      if (lVar30 != 0) {
        iVar22 = (int)((ulong)(*(long *)(lVar30 + 0x10) - *(long *)(lVar30 + 8)) >> 4);
      }
    }
    uVar34 = uVar32 - bVar3;
    bVar35 = uVar34 == iVar22 - (uint)bVar4;
    uVar21 = CONCAT71((int7)((ulong)pTVar38 >> 8),bVar35);
    if ((bVar35) && (uVar32 != bVar3)) {
      uVar32 = 0;
      do {
        iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])();
        uVar8 = TSmallArrayVector::getDimSize
                          ((TSmallArrayVector *)CONCAT44(extraout_var_07,iVar7),uVar32 + bVar3);
        iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x24])();
        uVar9 = TSmallArrayVector::getDimSize
                          ((TSmallArrayVector *)CONCAT44(extraout_var_08,iVar7),uVar32 + bVar4);
        uVar21 = CONCAT71((int7)(uVar21 >> 8),uVar8 == uVar9);
        if (uVar8 != uVar9) break;
        uVar32 = uVar32 + 1;
      } while (uVar32 < uVar34);
    }
  }
  else {
    pTVar33 = unitSymbol;
    iVar7 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                      (unitSymbol);
    bVar3 = isIoResizeArray((TType *)CONCAT44(extraout_var_00,iVar7),EVar39);
    pTVar38 = pTVar33;
    if (bVar3) goto LAB_00368968;
    iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
    iVar22 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                       (unitSymbol);
    bVar3 = TType::sameArrayness
                      ((TType *)CONCAT44(extraout_var_09,iVar7),
                       (TType *)CONCAT44(extraout_var_10,iVar22));
    uVar21 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
    if (!bVar3) {
      iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
      cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar7) + 0xe8))
                        ((long *)CONCAT44(extraout_var_11,iVar7));
      if (cVar5 != '\0') {
        iVar7 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                          (unitSymbol);
        cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar7) + 0xe8))
                          ((long *)CONCAT44(extraout_var_12,iVar7));
        if (cVar5 != '\0') {
          iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(symbol);
          cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar7) + 0x100))
                            ((long *)CONCAT44(extraout_var_13,iVar7));
          if (cVar5 == '\0') {
            iVar7 = (*(unitSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                              (unitSymbol);
            cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar7) + 0x100))
                              ((long *)CONCAT44(extraout_var_14,iVar7));
            if (cVar5 == '\0') {
              iVar7 = (*(symbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                (symbol);
              cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar7) + 0xf8))
                                ((long *)CONCAT44(extraout_var_15,iVar7));
              if (cVar5 == '\0') {
                iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])()
                ;
                uVar32 = (**(code **)(*(long *)CONCAT44(extraout_var_16,iVar7) + 0xf8))
                                   ((long *)CONCAT44(extraout_var_16,iVar7));
                uVar21 = (ulong)uVar32;
              }
            }
          }
          goto LAB_00368b74;
        }
      }
      uVar21 = 0;
    }
  }
LAB_00368b74:
  pTVar38 = pTVar24;
  iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
  pTVar16 = pTVar33;
  iVar22 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar33);
  local_434 = 0xffffffff;
  local_438 = 0xffffffff;
  uVar31 = (ulong)EVar29;
  EVar23 = EVar29;
  if (((TType *)CONCAT44(extraout_var_18,iVar22))->field_0x8 ==
      ((TType *)CONCAT44(extraout_var_17,iVar7))->field_0x8) {
    bVar3 = TType::sameElementShape
                      ((TType *)CONCAT44(extraout_var_17,iVar7),
                       (TType *)CONCAT44(extraout_var_18,iVar22),(int *)&local_434,(int *)&local_438
                      );
    if (!bVar3) {
      if ((int)(local_434 | local_438) < 0) {
        if (local_438 == 0xffffffff && -1 < (int)local_434) {
          pcVar20 = StageName(stage);
          local_3f8.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &errmsg,pcVar20,&local_3f8);
          pbVar15 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    append(&errmsg," block member has no corresponding member in ");
          pcVar20 = StageName(EVar29);
          pbVar15 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    append(pbVar15,pcVar20);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(pbVar15," block:");
          error(this,infoSink,errmsg._M_dataplus._M_p,EVar29);
          TInfoSinkBase::append(&infoSink->info,"    ");
          pcVar20 = StageName(stage);
          TInfoSinkBase::append(&infoSink->info,pcVar20);
          TInfoSinkBase::append(&infoSink->info," stage: Block: ");
          iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                            (pTVar24);
          pTVar14 = (TString *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_46,iVar7) + 0x28))
                              ((long *)CONCAT44(extraout_var_46,iVar7));
          TInfoSinkBase::append(&infoSink->info,pTVar14);
          TInfoSinkBase::append(&infoSink->info,", Member: ");
          iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                            (pTVar24);
          plVar11 = (long *)CONCAT44(extraout_var_47,iVar7);
          cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
          if (cVar5 == '\0') goto LAB_0036ae1b;
          pTVar14 = (TString *)
                    (**(code **)(**(long **)(*(long *)(plVar11[0xd] + 8) +
                                            (long)(int)local_434 * 0x20) + 0x30))();
          TInfoSinkBase::append(&infoSink->info,pTVar14);
          TInfoSinkBase::append(&infoSink->info,"\n");
          TInfoSinkBase::append(&infoSink->info,"    ");
          pcVar20 = StageName(EVar29);
          TInfoSinkBase::append(&infoSink->info,pcVar20);
          TInfoSinkBase::append(&infoSink->info," stage: Block: ");
          pp_Var18 = (pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode;
          pTVar25 = pTVar33;
        }
        else {
          if (local_434 != 0xffffffff || (int)local_438 < 0) goto LAB_00368bbd;
          pcVar20 = StageName(EVar29);
          local_3f8.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &errmsg,pcVar20,&local_3f8);
          pbVar15 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    append(&errmsg," block member has no corresponding member in ");
          pcVar20 = StageName(stage);
          pbVar15 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    append(pbVar15,pcVar20);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(pbVar15," block:");
          error(this,infoSink,errmsg._M_dataplus._M_p,EVar29);
          TInfoSinkBase::append(&infoSink->info,"    ");
          pcVar20 = StageName(EVar29);
          TInfoSinkBase::append(&infoSink->info,pcVar20);
          TInfoSinkBase::append(&infoSink->info," stage: Block: ");
          iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                            (pTVar33);
          pTVar14 = (TString *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_x00144,iVar7) + 0x28))
                              ((long *)CONCAT44(extraout_var_x00144,iVar7));
          TInfoSinkBase::append(&infoSink->info,pTVar14);
          TInfoSinkBase::append(&infoSink->info,", Member: ");
          iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                            (pTVar33);
          plVar11 = (long *)CONCAT44(extraout_var_x00145,iVar7);
          cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
          if (cVar5 == '\0') goto LAB_0036ae1b;
          pTVar14 = (TString *)
                    (**(code **)(**(long **)(*(long *)(plVar11[0xd] + 8) +
                                            (long)(int)local_438 * 0x20) + 0x30))();
          TInfoSinkBase::append(&infoSink->info,pTVar14);
          TInfoSinkBase::append(&infoSink->info,"\n");
          TInfoSinkBase::append(&infoSink->info,"    ");
          pcVar20 = StageName(stage);
          TInfoSinkBase::append(&infoSink->info,pcVar20);
          TInfoSinkBase::append(&infoSink->info," stage: Block: ");
          pp_Var18 = (pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode;
          pTVar25 = pTVar24;
        }
        iVar7 = (*pp_Var18[0x1e])(pTVar25);
        lVar30 = *(long *)CONCAT44(extraout_var_x00146,iVar7);
        pTVar14 = (TString *)
                  (**(code **)(lVar30 + 0x28))((long *)CONCAT44(extraout_var_x00146,iVar7));
        TInfoSinkBase::append(&infoSink->info,pTVar14);
        TInfoSinkBase::append(&infoSink->info,", Member: n/a \n");
        local_42c = (uint)CONCAT71((int7)((ulong)lVar30 >> 8),1);
        uVar21 = 0;
      }
      else {
        error(this,infoSink,"Member names and types must match:",EVar29);
        TInfoSinkBase::append(&infoSink->info,"    Block: ");
        iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
        pTVar14 = (TString *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_41,iVar7) + 0x28))
                            ((long *)CONCAT44(extraout_var_41,iVar7));
        TInfoSinkBase::append(&infoSink->info,pTVar14);
        TInfoSinkBase::append(&infoSink->info,"\n");
        TInfoSinkBase::append(&infoSink->info,"        ");
        pcVar20 = StageName(stage);
        TInfoSinkBase::append(&infoSink->info,pcVar20);
        TInfoSinkBase::append(&infoSink->info," stage: \"");
        iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
        plVar11 = (long *)CONCAT44(extraout_var_42,iVar7);
        cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
        if (cVar5 == '\0') goto LAB_0036ae1b;
        uVar12 = *(undefined8 *)(*(long *)(plVar11[0xd] + 8) + (long)(int)local_434 * 0x20);
        uVar10 = (undefined4)uVar12;
        uVar40 = (undefined4)((ulong)uVar12 >> 0x20);
        iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
        plVar11 = (long *)CONCAT44(extraout_var_43,iVar7);
        cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
        if (cVar5 == '\0') goto LAB_0036ae1b;
        lVar30 = (**(code **)(**(long **)(*(long *)(plVar11[0xd] + 8) + (long)(int)local_434 * 0x20)
                             + 0x30))();
        local_58 = GetThreadPoolAllocator();
        local_50 = local_40;
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                             *)&local_58,*(long *)(lVar30 + 8),
                            *(long *)(lVar30 + 0x10) + *(long *)(lVar30 + 8));
        local_80 = GetThreadPoolAllocator();
        local_78 = local_68;
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_80,"");
        name_01._M_dataplus._M_p = (pointer)&local_80;
        name_01._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_58;
        name_01._16_12_ = in_stack_fffffffffffffb88;
        name_01.field_2._M_allocated_capacity._4_4_ = EVar23;
        name_01.field_2._8_4_ = (int)pTVar38;
        name_01.field_2._12_4_ = (int)((ulong)pTVar38 >> 0x20);
        structName_01._M_dataplus._M_p = (pointer)pTVar16;
        structName_01._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)this;
        structName_01._M_string_length._0_4_ = stage;
        structName_01._M_string_length._4_4_ = in_stack_fffffffffffffbb4;
        structName_01.field_2._M_allocated_capacity._0_4_ = uVar10;
        structName_01.field_2._M_allocated_capacity._4_4_ = uVar40;
        structName_01.field_2._8_4_ = in_stack_fffffffffffffbc0;
        structName_01.field_2._12_4_ = in_stack_fffffffffffffbc4;
        TType::getCompleteString
                  (&errmsg,(TType *)CONCAT44(uVar40,uVar10),true,false,false,true,name_01,
                   structName_01);
        TInfoSinkBase::append(&infoSink->info,&errmsg);
        TInfoSinkBase::append(&infoSink->info,"\"\n");
        TInfoSinkBase::append(&infoSink->info,"        ");
        pcVar20 = StageName(EVar29);
        TInfoSinkBase::append(&infoSink->info,pcVar20);
        TInfoSinkBase::append(&infoSink->info," stage: \"");
        pTVar33 = pTVar16;
        iVar7 = (*(pTVar16->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar16);
        plVar11 = (long *)CONCAT44(extraout_var_44,iVar7);
        cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
        if (cVar5 == '\0') goto LAB_0036ae1b;
        uVar12 = *(undefined8 *)(*(long *)(plVar11[0xd] + 8) + (long)(int)local_438 * 0x20);
        uVar10 = (undefined4)uVar12;
        in_stack_fffffffffffffbbc = (undefined4)((ulong)uVar12 >> 0x20);
        iVar7 = (*(pTVar16->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar16);
        plVar11 = (long *)CONCAT44(extraout_var_45,iVar7);
        cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
        if (cVar5 == '\0') goto LAB_0036ae1b;
        lVar30 = (**(code **)(**(long **)(*(long *)(plVar11[0xd] + 8) + (long)(int)local_438 * 0x20)
                             + 0x30))();
        local_a8 = GetThreadPoolAllocator();
        local_a0 = local_90;
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                             *)&local_a8,*(long *)(lVar30 + 8),
                            *(long *)(lVar30 + 0x10) + *(long *)(lVar30 + 8));
        local_d0 = GetThreadPoolAllocator();
        local_c8 = local_b8;
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                   &local_d0,"");
        uVar12 = 0;
        name_02._M_dataplus._M_p = (pointer)&local_d0;
        name_02._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_a8;
        name_02._16_12_ = in_stack_fffffffffffffb88;
        name_02.field_2._M_allocated_capacity._4_4_ = EVar23;
        name_02.field_2._8_4_ = (int)pTVar38;
        name_02.field_2._12_4_ = (int)((ulong)pTVar38 >> 0x20);
        structName_02._M_dataplus._M_p = (pointer)pTVar33;
        structName_02._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)this;
        structName_02._M_string_length._0_4_ = stage;
        structName_02._M_string_length._4_4_ = in_stack_fffffffffffffbb4;
        structName_02.field_2._M_allocated_capacity._0_4_ = uVar10;
        structName_02.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffbbc;
        structName_02.field_2._8_4_ = in_stack_fffffffffffffbc0;
        structName_02.field_2._12_4_ = in_stack_fffffffffffffbc4;
        TType::getCompleteString
                  (&errmsg,(TType *)CONCAT44(in_stack_fffffffffffffbbc,uVar10),true,false,false,true
                   ,name_02,structName_02);
        uVar21 = 0;
        TInfoSinkBase::append(&infoSink->info,&errmsg);
        pTVar24 = pTVar38;
        TInfoSinkBase::append(&infoSink->info,"\"\n");
        local_42c = (uint)CONCAT71((int7)((ulong)uVar12 >> 8),1);
        pTVar16 = pTVar33;
        pTVar38 = pTVar24;
      }
      goto LAB_00368bd9;
    }
    if ((char)uVar21 == '\0') {
      pcVar20 = "Array sizes must be compatible:";
      goto LAB_00368bc4;
    }
    iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
    iVar22 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar33);
    this_00 = *(TTypeParameters **)(CONCAT44(extraout_var_39,iVar7) + 0x88);
    rhs = *(TTypeParameters **)(CONCAT44(extraout_var_40,iVar22) + 0x88);
    if ((this_00 == (TTypeParameters *)0x0) || (rhs == (TTypeParameters *)0x0)) {
      local_42c = 0;
      uVar21 = 0;
      if (this_00 != (TTypeParameters *)0x0 || rhs != (TTypeParameters *)0x0) goto LAB_0036aa1f;
    }
    else {
      bVar3 = TTypeParameters::operator==(this_00,rhs);
      local_42c = 0;
      uVar21 = 0;
      if (!bVar3) {
LAB_0036aa1f:
        uVar21 = 0;
        pcVar20 = "Type parameters must match:";
        goto LAB_00368bc4;
      }
    }
  }
  else {
LAB_00368bbd:
    pcVar20 = "Types must match:";
LAB_00368bc4:
    error(this,infoSink,pcVar20,EVar29);
    uVar21 = CONCAT71((int7)(uVar21 >> 8),1);
    local_42c = 0;
  }
LAB_00368bd9:
  iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
  iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar7) + 0x38))
                    ((long *)CONCAT44(extraout_var_19,iVar7));
  local_430 = (uint)uVar21;
  if (iVar7 == 0x10) {
    iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar33);
    iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_20,iVar7) + 0x38))
                      ((long *)CONCAT44(extraout_var_20,iVar7));
    if (iVar7 == 0x10) {
      iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
      plVar11 = (long *)CONCAT44(extraout_var_21,iVar7);
      cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
      if (cVar5 == '\0') goto LAB_0036ae1b;
      if (plVar11[0xd] != 0) {
        iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar33);
        plVar11 = (long *)CONCAT44(extraout_var_22,iVar7);
        cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
        if (cVar5 == '\0') goto LAB_0036ae1b;
        if (plVar11[0xd] != 0) {
          iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                            (pTVar24);
          iVar22 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                             (pTVar33);
          bVar3 = TType::sameStructType
                            ((TType *)CONCAT44(extraout_var_23,iVar7),
                             (TType *)CONCAT44(extraout_var_24,iVar22),(int *)0x0,(int *)0x0);
          if (bVar3) {
            iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                              (pTVar24);
            plVar11 = (long *)CONCAT44(extraout_var_25,iVar7);
            cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
            if (cVar5 != '\0') {
              iVar7 = 0;
              in_stack_fffffffffffffbbc = 0;
              uVar32 = 0;
LAB_00368cde:
              lVar30 = CONCAT44(in_stack_fffffffffffffbbc,iVar7) * 0x20;
              do {
                pTVar24 = pTVar38;
                if ((ulong)(*(long *)(plVar11[0xd] + 0x10) - *(long *)(plVar11[0xd] + 8) >> 5) <=
                    CONCAT44(in_stack_fffffffffffffbbc,iVar7)) {
LAB_00369818:
                  uVar31 = (ulong)EVar23;
                  uVar21 = (ulong)local_430;
                  pTVar38 = pTVar24;
                  goto LAB_00369827;
                }
                iVar22 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                   (pTVar33);
                plVar11 = (long *)CONCAT44(extraout_var_26,iVar22);
                pTVar24 = pTVar38;
                cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
                if (cVar5 == '\0') break;
                if ((ulong)(*(long *)(plVar11[0xd] + 0x10) - *(long *)(plVar11[0xd] + 8) >> 5) <=
                    (ulong)uVar32) goto LAB_00369818;
                iVar22 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                   ();
                plVar11 = (long *)CONCAT44(extraout_var_27,iVar22);
                cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
                if (cVar5 == '\0') break;
                cVar5 = (**(code **)(**(long **)(*(long *)(plVar11[0xd] + 8) + lVar30) + 0x18))();
                if (cVar5 != '\0') goto LAB_003692b6;
                iVar22 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                   (pTVar33);
                plVar11 = (long *)CONCAT44(extraout_var_28,iVar22);
                cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
                if (cVar5 == '\0') break;
                lVar28 = (ulong)uVar32 * 0x20;
                cVar5 = (**(code **)(**(long **)(*(long *)(plVar11[0xd] + 8) + lVar28) + 0x18))();
                if (cVar5 == '\0') goto LAB_00368df7;
                uVar32 = uVar32 + 1;
                iVar22 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                                   ();
                plVar11 = (long *)CONCAT44(extraout_var_29,iVar22);
                pTVar38 = pTVar24;
                cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
                if (cVar5 == '\0') break;
              } while( true );
            }
            goto LAB_0036ae1b;
          }
        }
      }
    }
  }
LAB_00369827:
  bVar27 = (byte)uVar21;
  if ((stage == (EShLanguage)uVar31) ||
     (((iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar24),
       (*(uint *)(CONCAT44(extraout_var_48,iVar7) + 8) & 0x7f) != 3 ||
       (iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33),
       (*(uint *)(CONCAT44(extraout_var_49,iVar7) + 8) & 0x7f) != 4)) &&
      ((iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar24),
       (*(uint *)(CONCAT44(extraout_var_50,iVar7) + 8) & 0x7f) != 4 ||
       (iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33),
       (*(uint *)(CONCAT44(extraout_var_51,iVar7) + 8) & 0x7f) != 3)))))) {
    iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar24);
    uVar32 = *(uint *)(CONCAT44(extraout_var_52,iVar7) + 8);
    iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33);
    if (((uVar32 ^ *(uint *)(CONCAT44(extraout_var_53,iVar7) + 8)) & 0x7f) == 0) {
      uVar12 = 0;
      bVar3 = false;
      goto LAB_003698da;
    }
    error(this,infoSink,"Storage qualifiers must match:",(EShLanguage)uVar31);
    uVar10 = (undefined4)CONCAT71((int7)((ulong)pTVar24 >> 8),1);
    uVar12 = 0;
    bVar3 = false;
    bVar27 = 1;
  }
  else {
    uVar12 = CONCAT71((int7)(uVar31 >> 8),1);
    bVar3 = true;
LAB_003698da:
    uVar10 = 0;
  }
  pTVar24 = pTVar38;
  iVar7 = (*(pTVar38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar38);
  if ((*(uint *)(CONCAT44(extraout_var_54,iVar7) + 8) & 0x7f) - 5 < 2) {
    iVar7 = (*(pTVar38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar38);
    iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      CONCAT44(extraout_var_55,iVar7),0,5,"anon@");
    iVar22 = (*(pTVar16->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar16);
    pTVar33 = pTVar16;
    iVar22 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_56,iVar22),0,5,"anon@");
    pTVar16 = pTVar33;
    if ((iVar7 == 0) != (iVar22 == 0)) {
      error(this,infoSink,
            "Matched Uniform or Storage blocks must all be anonymous, or all be named:",EVar23);
      bVar27 = 1;
    }
  }
  pTVar38 = pTVar24;
  iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar24);
  uVar32 = *(uint *)(CONCAT44(extraout_var_57,iVar7) + 8);
  iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33);
  EVar39 = stage;
  pTVar25 = pTVar38;
  if (((uVar32 ^ *(uint *)(CONCAT44(extraout_var_58,iVar7) + 8)) & 0x7f) == 0) {
    iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar24);
    iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      CONCAT44(extraout_var_59,iVar7),0,5,"anon@");
    iVar22 = (*(pTVar16->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar16);
    pTVar33 = pTVar16;
    iVar22 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var_60,iVar22),0,5,"anon@");
    pTVar16 = pTVar33;
    EVar39 = stage;
    if ((iVar22 == 0) == (iVar7 == 0)) {
      pTVar25 = pTVar38;
      iVar7 = (*(pTVar38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar38);
      iVar7 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)CONCAT44(extraout_var_61,iVar7),0,5,"anon@");
      if (iVar7 != 0) {
        iVar7 = (*(pTVar38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar38);
        iVar22 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar33)
        ;
        pTVar38 = pTVar25;
        iVar7 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_62,iVar7),
                           (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_63,iVar22));
        pTVar25 = pTVar38;
        if (iVar7 != 0) goto LAB_00369a64;
      }
    }
    else {
LAB_00369a64:
      warn(this,infoSink,"Matched shader interfaces are using different instance names.",EVar23);
      bVar27 = 1;
      pTVar25 = pTVar38;
    }
  }
  if (bVar3) {
    uVar12 = 0;
    EVar29 = EVar23;
  }
  else {
    iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    uVar32 = *(uint *)(CONCAT44(extraout_var_64,iVar7) + 8);
    iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33);
    EVar29 = EVar23;
    if (((uVar32 ^ *(uint *)(CONCAT44(extraout_var_65,iVar7) + 8)) & 0xe000000) == 0) {
      uVar12 = 0;
    }
    else {
      error(this,infoSink,"Precision qualifiers must match:",EVar23);
      uVar12 = CONCAT71((int7)((ulong)uVar12 >> 8),1);
      bVar27 = 1;
    }
  }
  uVar32 = (uint)uVar12;
  uVar40 = uVar10;
  if (stage == EVar23) {
    iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    uVar34 = *(uint *)(CONCAT44(extraout_var_66,iVar7) + 8);
    iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33);
    if (((uVar34 ^ *(uint *)(CONCAT44(extraout_var_67,iVar7) + 8)) >> 0x1c & 1) != 0) {
      error(this,infoSink,"Presence of invariant qualifier must match:",stage);
      uVar10 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
      bVar27 = 1;
    }
    iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    uVar2 = *(undefined8 *)(CONCAT44(extraout_var_68,iVar7) + 8);
    iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33);
    if (((byte)(uint)((ulong)uVar2 >> 0x24) & 1) !=
        (*(byte *)(CONCAT44(extraout_var_69,iVar7) + 0xc) & 0x10) >> 4) {
      error(this,infoSink,"Presence of precise qualifier must match:",stage);
      uVar32 = (uint)CONCAT71((int7)((ulong)uVar12 >> 8),1);
      bVar27 = 1;
    }
    pTVar24 = pTVar25;
    iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar25);
    uVar34 = *(uint *)(CONCAT44(extraout_var_70,iVar7) + 8);
    iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33);
    uVar40 = uVar10;
    if (((uVar34 ^ *(uint *)(CONCAT44(extraout_var_71,iVar7) + 8)) >> 0x1d & 1) == 0) {
      iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar25);
      uVar34 = *(uint *)(CONCAT44(extraout_var_72,iVar7) + 8);
      iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33);
      uVar40 = uVar10;
      if (((uVar34 ^ *(uint *)(CONCAT44(extraout_var_73,iVar7) + 8)) >> 0x1e & 1) == 0) {
        iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar25);
        iVar7 = *(int *)(CONCAT44(extraout_var_74,iVar7) + 8);
        iVar22 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33)
        ;
        uVar40 = uVar10;
        if (iVar7 < 0 != ((*(byte *)(CONCAT44(extraout_var_75,iVar22) + 0xb) & 0x80) == 0)) {
          iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                            (pTVar25);
          uVar12 = *(undefined8 *)(CONCAT44(extraout_var_76,iVar7) + 8);
          iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                            (pTVar33);
          uVar40 = uVar10;
          if (((byte)(uint)((ulong)uVar12 >> 0x2d) & 1) ==
              (*(byte *)(CONCAT44(extraout_var_77,iVar7) + 0xd) & 0x20) >> 5) {
            iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                              (pTVar25);
            uVar12 = *(undefined8 *)(CONCAT44(extraout_var_78,iVar7) + 8);
            iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                              (pTVar33);
            uVar40 = uVar10;
            if (((byte)(uint)((ulong)uVar12 >> 0x2c) & 1) ==
                (*(byte *)(CONCAT44(extraout_var_79,iVar7) + 0xd) & 0x10) >> 4) {
              iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                                (pTVar25);
              uVar12 = *(undefined8 *)(CONCAT44(extraout_var_80,iVar7) + 8);
              pTVar25 = pTVar24;
              iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])
                                (pTVar33);
              uVar40 = uVar10;
              pTVar24 = pTVar25;
              if (((byte)(uint)((ulong)uVar12 >> 0x25) & 1) ==
                  (*(byte *)(CONCAT44(extraout_var_81,iVar7) + 0xc) & 0x20) >> 5) goto LAB_00369cb6;
            }
          }
        }
      }
    }
    pTVar25 = pTVar24;
    error(this,infoSink,"Interpolation and auxiliary storage qualifiers must match:",stage);
    uVar10 = 1;
    bVar27 = 1;
  }
LAB_00369cb6:
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar21 = *(ulong *)(CONCAT44(extraout_var_82,iVar7) + 8);
  iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33);
  uVar21 = (uVar21 ^ *(ulong *)(CONCAT44(extraout_var_83,iVar7) + 8)) & 0x2000000000000;
  uVar31 = uVar21 >> 0x31;
  if (uVar21 != 0) {
    error(this,infoSink,"Memory coherent qualifier must match:",EVar29);
  }
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar21 = *(ulong *)(CONCAT44(extraout_var_84,iVar7) + 8);
  iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33);
  if (((uVar21 ^ *(ulong *)(CONCAT44(extraout_var_85,iVar7) + 8)) >> 0x34 & 1) != 0) {
    error(this,infoSink,"Memory devicecoherent qualifier must match:",EVar29);
    uVar31 = 1;
  }
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar21 = *(ulong *)(CONCAT44(extraout_var_86,iVar7) + 8);
  iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33);
  if (((uVar21 ^ *(ulong *)(CONCAT44(extraout_var_87,iVar7) + 8)) >> 0x35 & 1) != 0) {
    error(this,infoSink,"Memory queuefamilycoherent qualifier must match:",EVar29);
    uVar31 = 1;
  }
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar21 = *(ulong *)(CONCAT44(extraout_var_88,iVar7) + 8);
  iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33);
  if (((uVar21 ^ *(ulong *)(CONCAT44(extraout_var_89,iVar7) + 8)) >> 0x36 & 1) != 0) {
    error(this,infoSink,"Memory workgroupcoherent qualifier must match:",EVar29);
    uVar31 = 1;
  }
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar21 = *(ulong *)(CONCAT44(extraout_var_90,iVar7) + 8);
  iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33);
  if (((uVar21 ^ *(ulong *)(CONCAT44(extraout_var_91,iVar7) + 8)) >> 0x37 & 1) != 0) {
    error(this,infoSink,"Memory subgroupcoherent qualifier must match:",EVar29);
    uVar31 = 1;
  }
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar21 = *(ulong *)(CONCAT44(extraout_var_92,iVar7) + 8);
  iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33);
  if (((uVar21 ^ *(ulong *)(CONCAT44(extraout_var_93,iVar7) + 8)) >> 0x38 & 1) != 0) {
    error(this,infoSink,"Memory shadercallcoherent qualifier must match:",EVar29);
    uVar31 = 1;
  }
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar21 = *(ulong *)(CONCAT44(extraout_var_94,iVar7) + 8);
  iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33);
  if (((uVar21 ^ *(ulong *)(CONCAT44(extraout_var_95,iVar7) + 8)) >> 0x39 & 1) != 0) {
    error(this,infoSink,"Memory nonprivate qualifier must match:",EVar29);
    uVar31 = 1;
  }
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar21 = *(ulong *)(CONCAT44(extraout_var_96,iVar7) + 8);
  iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33);
  if (((uVar21 ^ *(ulong *)(CONCAT44(extraout_var_97,iVar7) + 8)) >> 0x32 & 1) != 0) {
    error(this,infoSink,"Memory volatil qualifier must match:",EVar29);
    uVar31 = 1;
  }
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar21 = *(ulong *)(CONCAT44(extraout_var_98,iVar7) + 8);
  iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33);
  if (((uVar21 ^ *(ulong *)(CONCAT44(extraout_var_99,iVar7) + 8)) >> 0x33 & 1) != 0) {
    error(this,infoSink,"Memory nontemporal qualifier must match:",EVar29);
    uVar31 = 1;
  }
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar21 = *(ulong *)(CONCAT44(extraout_var_x00100,iVar7) + 8);
  iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33);
  if (((uVar21 ^ *(ulong *)(CONCAT44(extraout_var_x00101,iVar7) + 8)) >> 0x2e & 1) != 0) {
    error(this,infoSink,"Memory restrict qualifier must match:",EVar29);
    uVar31 = 1;
  }
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar21 = *(ulong *)(CONCAT44(extraout_var_x00102,iVar7) + 8);
  iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33);
  if (((uVar21 ^ *(ulong *)(CONCAT44(extraout_var_x00103,iVar7) + 8)) >> 0x2f & 1) != 0) {
    error(this,infoSink,"Memory readonly qualifier must match:",EVar29);
    uVar31 = 1;
  }
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar21 = *(ulong *)(CONCAT44(extraout_var_x00104,iVar7) + 8);
  iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar33);
  EVar23 = EVar29;
  if (((uVar21 ^ *(ulong *)(CONCAT44(extraout_var_x00105,iVar7) + 8)) >> 0x30 & 1) == 0) {
    uVar26 = 1;
    if (uVar31 == 0) {
      uVar26 = (char)uVar10;
    }
    bVar27 = bVar27 | (byte)uVar31;
  }
  else {
    error(this,infoSink,"Memory writeonly qualifier must match:",EVar29);
    uVar26 = 1;
    bVar27 = 1;
  }
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar21 = *(ulong *)(CONCAT44(extraout_var_x00106,iVar7) + 8);
  iVar7 = (*(pTVar16->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar21 = uVar21 ^ *(ulong *)(CONCAT44(extraout_var_x00107,iVar7) + 8);
  if (0x1fffffffffffffff < uVar21) {
    error(this,infoSink,"Layout matrix qualifier must match:",EVar29);
  }
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  bVar1 = *(byte *)(CONCAT44(extraout_var_x00108,iVar7) + 0x10);
  iVar7 = (*(pTVar16->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  bVar3 = ((bVar1 ^ *(byte *)(CONCAT44(extraout_var_x00109,iVar7) + 0x10)) & 0xf) != 0;
  if (bVar3) {
    error(this,infoSink,"Layout packing qualifier must match:",EVar29);
  }
  bVar3 = bVar3 || 0x1fffffffffffffff < uVar21;
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  pTVar24 = pTVar16;
  if (((~*(uint *)(CONCAT44(extraout_var_x00110,iVar7) + 0x1c) & 0xfff) != 0) &&
     (EVar29 = EVar23,
     iVar7 = (*(pTVar16->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar16),
     EVar23 = EVar29, (~*(uint *)(CONCAT44(extraout_var_x00111,iVar7) + 0x1c) & 0xfff) != 0)) {
    iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    uVar34 = *(uint *)(CONCAT44(extraout_var_x00112,iVar7) + 0x1c);
    iVar7 = (*(pTVar16->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar16);
    EVar23 = EVar29;
    if (((uVar34 ^ *(uint *)(CONCAT44(extraout_var_x00113,iVar7) + 0x1c)) & 0xfff) != 0) {
      error(this,infoSink,"Layout location qualifier must match:",EVar29);
      bVar3 = true;
    }
  }
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar34 = *(uint *)(CONCAT44(extraout_var_x00114,iVar7) + 0x1c);
  iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if (((uVar34 ^ *(uint *)(CONCAT44(extraout_var_x00115,iVar7) + 0x1c)) & 0x7000) != 0) {
    error(this,infoSink,"Layout component qualifier must match:",EVar29);
    bVar3 = true;
  }
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  uVar12 = *(undefined8 *)(CONCAT44(extraout_var_x00116,iVar7) + 0x1c);
  iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if ((char)((ulong)uVar12 >> 0x30) !=
      (char)((ulong)*(undefined8 *)(CONCAT44(extraout_var_x00117,iVar7) + 0x1c) >> 0x30)) {
    error(this,infoSink,"Layout index qualifier must match:",EVar29);
    bVar3 = true;
  }
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  pTVar38 = pTVar24;
  if (((~*(ulong *)(CONCAT44(extraout_var_x00118,iVar7) + 0x1c) & 0xffff00000000) != 0) &&
     (iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(pTVar24),
     (~*(ulong *)(CONCAT44(extraout_var_x00119,iVar7) + 0x1c) & 0xffff00000000) != 0)) {
    iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    uVar21 = *(ulong *)(CONCAT44(extraout_var_x00120,iVar7) + 0x1c);
    iVar7 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    if (((uVar21 ^ *(ulong *)(CONCAT44(extraout_var_x00121,iVar7) + 0x1c)) & 0xffff00000000) != 0) {
      error(this,infoSink,"Layout binding qualifier must match:",EVar23);
      bVar3 = true;
    }
  }
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
  if ((~*(ulong *)(CONCAT44(extraout_var_x00122,iVar7) + 0x1c) & 0xffff00000000) == 0) {
LAB_0036a286:
    getQualifiers = 1;
    if (!bVar3) {
      getQualifiers = uVar26;
    }
    if ((bVar27 & 1) == 0 && !bVar3) {
      if ((local_42c & 1) != 0) {
        return;
      }
      if ((pTVar25->constArray).unionArray == (TConstUnionVector *)0x0) {
        return;
      }
      if ((pTVar38->constArray).unionArray == (TConstUnionVector *)0x0) {
        return;
      }
      bVar3 = TConstUnionArray::operator==(&pTVar25->constArray,&pTVar38->constArray);
      if (bVar3) {
        return;
      }
      error(this,infoSink,"Initializers must match:",EVar23);
      TInfoSinkBase::append(&infoSink->info,"    ");
      iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar25);
      TInfoSinkBase::append(&infoSink->info,(TString *)CONCAT44(extraout_var_x00125,iVar7));
      pcVar20 = "\n";
      goto LAB_0036a9f7;
    }
  }
  else {
    iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    iVar7 = *(int *)(CONCAT44(extraout_var_x00123,iVar7) + 0x14);
    iVar22 = (*(pTVar38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    if (iVar7 == *(int *)(CONCAT44(extraout_var_x00124,iVar22) + 0x14)) goto LAB_0036a286;
    error(this,infoSink,"Layout offset qualifier must match:",EVar23);
    getQualifiers = true;
  }
  pTVar33 = pTVar38;
  pTVar24 = pTVar25;
  iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar25);
  iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_x00126,iVar7) + 0x38))
                    ((long *)CONCAT44(extraout_var_x00126,iVar7));
  cVar5 = (char)local_430;
  if (iVar7 == 0x10) {
    iVar7 = (*(pTVar38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar38);
    iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_x00127,iVar7) + 0x38))
                      ((long *)CONCAT44(extraout_var_x00127,iVar7));
    if (iVar7 != 0x10) goto LAB_0036a61e;
    iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar25);
    plVar11 = (long *)CONCAT44(extraout_var_x00128,iVar7);
    cVar6 = (**(code **)(*plVar11 + 0x128))(plVar11);
    if (cVar6 == '\0') {
LAB_0036ae1b:
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
    }
    if (plVar11[0xd] == 0) goto LAB_0036a61e;
    iVar7 = (*(pTVar38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar38);
    plVar11 = (long *)CONCAT44(extraout_var_x00129,iVar7);
    cVar6 = (**(code **)(*plVar11 + 0x128))(plVar11);
    if (cVar6 == '\0') goto LAB_0036ae1b;
    if (plVar11[0xd] == 0) goto LAB_0036a61e;
    TInfoSinkBase::append(&infoSink->info,"    ");
    pcVar20 = StageName(EVar39);
    TInfoSinkBase::append(&infoSink->info,pcVar20);
    if (cVar5 != '\0') {
      TInfoSinkBase::append(&infoSink->info," stage: \"");
      iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar25);
      pTVar16 = (TIntermSymbol *)CONCAT44(extraout_var_x00130,iVar7);
      iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar25);
      local_300 = GetThreadPoolAllocator();
      lVar30 = *(long *)(CONCAT44(extraout_var_x00131,iVar7) + 8);
      local_2f8 = local_2e8;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *
                          )&local_300,lVar30,
                          *(long *)(CONCAT44(extraout_var_x00131,iVar7) + 0x10) + lVar30);
      iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar25);
      uVar10 = (undefined4)((ulong)pTVar24 >> 0x20);
      lVar30 = (**(code **)(*(long *)CONCAT44(extraout_var_x00132,iVar7) + 0x28))
                         ((long *)CONCAT44(extraout_var_x00132,iVar7));
      local_f8 = GetThreadPoolAllocator();
      local_f0 = local_e0;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *
                          )&local_f8,*(long *)(lVar30 + 8),
                          *(long *)(lVar30 + 0x10) + *(long *)(lVar30 + 8));
      uVar34 = (uint)(byte)getQualifiers;
      uVar26 = (undefined1)uVar32;
      name_03._M_dataplus._M_p = (pointer)&local_f8;
      name_03._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_300;
      name_03._16_12_ = in_stack_fffffffffffffb88;
      name_03.field_2._M_allocated_capacity._4_4_ = EVar23;
      name_03.field_2._M_local_buf[8] = getQualifiers;
      name_03.field_2._9_3_ = 0;
      name_03.field_2._12_4_ = uVar10;
      structName_03._M_dataplus._M_p = (pointer)pTVar16;
      structName_03._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)this;
      structName_03._M_string_length._0_4_ = EVar39;
      structName_03._M_string_length._4_4_ = in_stack_fffffffffffffbb4;
      structName_03.field_2._M_allocated_capacity._0_4_ = uVar40;
      structName_03.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffbbc;
      structName_03.field_2._8_4_ = uVar32;
      structName_03.field_2._12_4_ = in_stack_fffffffffffffbc4;
      TType::getCompleteString
                (&errmsg,(TType *)pTVar16,true,(bool)getQualifiers,(bool)uVar26,true,name_03,
                 structName_03);
      TInfoSinkBase::append(&infoSink->info,&errmsg);
      TInfoSinkBase::append(&infoSink->info,"\"\n");
      TInfoSinkBase::append(&infoSink->info,"    ");
      pcVar20 = StageName(EVar23);
      TInfoSinkBase::append(&infoSink->info,pcVar20);
      TInfoSinkBase::append(&infoSink->info," stage: \"");
      iVar7 = (*(pTVar38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar38);
      pTVar17 = (TType *)CONCAT44(extraout_var_x00133,iVar7);
      iVar7 = (*(pTVar38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar38);
      local_328 = GetThreadPoolAllocator();
      lVar30 = *(long *)(CONCAT44(extraout_var_x00134,iVar7) + 8);
      local_320 = local_310;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *
                          )&local_328,lVar30,
                          *(long *)(CONCAT44(extraout_var_x00134,iVar7) + 0x10) + lVar30);
      iVar7 = (*(pTVar38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar38);
      lVar30 = (**(code **)(*(long *)CONCAT44(extraout_var_x00135,iVar7) + 0x28))
                         ((long *)CONCAT44(extraout_var_x00135,iVar7));
      local_120 = GetThreadPoolAllocator();
      pbVar37 = (basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                &local_120;
      local_118 = local_108;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char*>(pbVar37,*(long *)(lVar30 + 8),
                          *(long *)(lVar30 + 0x10) + *(long *)(lVar30 + 8));
      getQualifiers = (undefined1)uVar34;
      bVar3 = true;
      pbVar36 = (basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                &local_328;
      goto LAB_0036a9d9;
    }
    TInfoSinkBase::append(&infoSink->info," stage: Block: ");
    iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar25);
    pTVar14 = (TString *)
              (**(code **)(*(long *)CONCAT44(extraout_var_x00147,iVar7) + 0x28))
                        ((long *)CONCAT44(extraout_var_x00147,iVar7));
    TInfoSinkBase::append(&infoSink->info,pTVar14);
    TInfoSinkBase::append(&infoSink->info," Instance: ");
    iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar25);
    TInfoSinkBase::append(&infoSink->info,(TString *)CONCAT44(extraout_var_x00148,iVar7));
    TInfoSinkBase::append(&infoSink->info,": \"");
    iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar25);
    local_350 = GetThreadPoolAllocator();
    local_348 = local_338;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_350
               ,"","");
    uVar10 = (undefined4)((ulong)pTVar24 >> 0x20);
    local_148 = GetThreadPoolAllocator();
    local_140 = local_130;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_148
               ,"","");
    uVar34 = uVar32 & 0xff;
    name_08._M_dataplus._M_p = (pointer)&local_148;
    name_08._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_350;
    name_08._16_12_ = in_stack_fffffffffffffb88;
    name_08.field_2._M_allocated_capacity._4_4_ = EVar23;
    name_08.field_2._8_4_ = uVar34;
    name_08.field_2._12_4_ = uVar10;
    structName_08._M_dataplus._M_p = (pointer)pTVar33;
    structName_08._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)this;
    structName_08._M_string_length._0_4_ = EVar39;
    structName_08._M_string_length._4_4_ = in_stack_fffffffffffffbb4;
    structName_08.field_2._M_allocated_capacity._0_4_ = uVar40;
    structName_08.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffbbc;
    structName_08.field_2._8_4_ = uVar32;
    structName_08.field_2._12_4_ = in_stack_fffffffffffffbc4;
    TType::getCompleteString
              (&errmsg,(TType *)CONCAT44(extraout_var_x00149,iVar7),true,(bool)getQualifiers,
               SUB41(uVar32,0),false,name_08,structName_08);
    TInfoSinkBase::append(&infoSink->info,&errmsg);
    TInfoSinkBase::append(&infoSink->info,"\"\n");
    TInfoSinkBase::append(&infoSink->info,"    ");
    pcVar20 = StageName(EVar23);
    TInfoSinkBase::append(&infoSink->info,pcVar20);
    TInfoSinkBase::append(&infoSink->info," stage: Block: ");
    iVar7 = (*(pTVar38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar38);
    pTVar14 = (TString *)
              (**(code **)(*(long *)CONCAT44(extraout_var_x00150,iVar7) + 0x28))
                        ((long *)CONCAT44(extraout_var_x00150,iVar7));
    TInfoSinkBase::append(&infoSink->info,pTVar14);
    TInfoSinkBase::append(&infoSink->info," Instance: ");
    iVar7 = (*(pTVar38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar38);
    TInfoSinkBase::append(&infoSink->info,(TString *)CONCAT44(extraout_var_x00151,iVar7));
    TInfoSinkBase::append(&infoSink->info,": \"");
    iVar7 = (*(pTVar38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar38);
    local_170 = GetThreadPoolAllocator();
    local_168 = local_158;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_170
               ,"","");
    local_198 = GetThreadPoolAllocator();
    local_190 = local_180;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_198
               ,"","");
    name_09._M_dataplus._M_p = (pointer)&local_198;
    name_09._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_170;
    name_09._16_12_ = in_stack_fffffffffffffb88;
    name_09.field_2._M_allocated_capacity._4_4_ = EVar23;
    name_09.field_2._8_4_ = uVar34;
    name_09.field_2._12_4_ = uVar10;
    structName_09._M_dataplus._M_p = (pointer)pTVar33;
    structName_09._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)this;
    structName_09._M_string_length._0_4_ = EVar39;
    structName_09._M_string_length._4_4_ = in_stack_fffffffffffffbb4;
    structName_09.field_2._M_allocated_capacity._0_4_ = uVar40;
    structName_09.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffbbc;
    structName_09.field_2._8_4_ = uVar32;
    structName_09.field_2._12_4_ = in_stack_fffffffffffffbc4;
    TType::getCompleteString
              (&errmsg,(TType *)CONCAT44(extraout_var_x00152,iVar7),true,(bool)getQualifiers,
               SUB41(uVar34,0),false,name_09,structName_09);
  }
  else {
LAB_0036a61e:
    TInfoSinkBase::append(&infoSink->info,"    ");
    pcVar20 = StageName(EVar39);
    TInfoSinkBase::append(&infoSink->info,pcVar20);
    if (cVar5 == '\0') {
      TInfoSinkBase::append(&infoSink->info," stage: ");
      iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar25);
      TInfoSinkBase::append(&infoSink->info,(TString *)CONCAT44(extraout_var_x00140,iVar7));
      TInfoSinkBase::append(&infoSink->info," \"");
      iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar25);
      local_260 = GetThreadPoolAllocator();
      local_258 = local_248;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_260,"","");
      local_288 = GetThreadPoolAllocator();
      uVar10 = (undefined4)((ulong)pTVar24 >> 0x20);
      local_280 = local_270;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_288,"","");
      uVar34 = uVar32 & 0xff;
      name_06._M_dataplus._M_p = (pointer)&local_288;
      name_06._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_260;
      name_06._16_12_ = in_stack_fffffffffffffb88;
      name_06.field_2._M_allocated_capacity._4_4_ = EVar23;
      name_06.field_2._8_4_ = uVar34;
      name_06.field_2._12_4_ = uVar10;
      structName_06._M_dataplus._M_p = (pointer)pTVar33;
      structName_06._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)this;
      structName_06._M_string_length._0_4_ = EVar39;
      structName_06._M_string_length._4_4_ = in_stack_fffffffffffffbb4;
      structName_06.field_2._M_allocated_capacity._0_4_ = uVar40;
      structName_06.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffbbc;
      structName_06.field_2._8_4_ = uVar32;
      structName_06.field_2._12_4_ = in_stack_fffffffffffffbc4;
      TType::getCompleteString
                (&errmsg,(TType *)CONCAT44(extraout_var_x00141,iVar7),true,(bool)getQualifiers,
                 SUB41(uVar32,0),false,name_06,structName_06);
      TInfoSinkBase::append(&infoSink->info,&errmsg);
      TInfoSinkBase::append(&infoSink->info,"\"\n");
      TInfoSinkBase::append(&infoSink->info,"    ");
      pcVar20 = StageName(EVar23);
      TInfoSinkBase::append(&infoSink->info,pcVar20);
      TInfoSinkBase::append(&infoSink->info," stage: ");
      pTVar16 = pTVar33;
      iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar33);
      TInfoSinkBase::append(&infoSink->info,(TString *)CONCAT44(extraout_var_x00142,iVar7));
      TInfoSinkBase::append(&infoSink->info," \"");
      iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar33);
      pTVar17 = (TType *)CONCAT44(extraout_var_x00143,iVar7);
      local_2b0 = GetThreadPoolAllocator();
      local_2a8 = local_298;
      pbVar36 = (basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                &local_2b0;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>(pbVar36,"","");
      local_2d8 = GetThreadPoolAllocator();
      local_2d0 = local_2c0;
      pbVar37 = (basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                &local_2d8;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>(pbVar37,"","");
      uVar26 = (undefined1)uVar34;
      bVar3 = false;
LAB_0036a9d9:
      name_07._M_dataplus._M_p = (pointer)pbVar37;
      name_07._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)pbVar36;
      name_07._16_12_ = in_stack_fffffffffffffb88;
      name_07.field_2._M_allocated_capacity._4_4_ = EVar23;
      name_07.field_2._8_4_ = uVar34;
      name_07.field_2._12_4_ = uVar10;
      structName_07._M_dataplus._M_p = (pointer)pTVar16;
      structName_07._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)this;
      structName_07._M_string_length._0_4_ = EVar39;
      structName_07._M_string_length._4_4_ = in_stack_fffffffffffffbb4;
      structName_07.field_2._M_allocated_capacity._0_4_ = uVar40;
      structName_07.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffbbc;
      structName_07.field_2._8_4_ = uVar32;
      structName_07.field_2._12_4_ = in_stack_fffffffffffffbc4;
      TType::getCompleteString
                (&errmsg,pTVar17,true,(bool)getQualifiers,(bool)uVar26,bVar3,name_07,structName_07);
    }
    else {
      TInfoSinkBase::append(&infoSink->info," stage: \"");
      iVar7 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar25);
      iVar22 = (*(pTVar25->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
      local_1c0 = GetThreadPoolAllocator();
      lVar30 = *(long *)(CONCAT44(extraout_var_x00137,iVar22) + 8);
      local_1b8 = local_1a8;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *
                          )&local_1c0,lVar30,
                          *(long *)(CONCAT44(extraout_var_x00137,iVar22) + 0x10) + lVar30);
      uVar10 = (undefined4)((ulong)pTVar24 >> 0x20);
      local_1e8 = GetThreadPoolAllocator();
      local_1e0 = local_1d0;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_1e8,"");
      uVar34 = (uint)(byte)getQualifiers;
      bVar3 = SUB41(uVar32,0);
      name_04._M_dataplus._M_p = (pointer)&local_1e8;
      name_04._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_1c0;
      name_04._16_12_ = in_stack_fffffffffffffb88;
      name_04.field_2._M_allocated_capacity._4_4_ = EVar23;
      name_04.field_2._M_local_buf[8] = getQualifiers;
      name_04.field_2._9_3_ = 0;
      name_04.field_2._12_4_ = uVar10;
      structName_04._M_dataplus._M_p = (pointer)pTVar33;
      structName_04._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)this;
      structName_04._M_string_length._0_4_ = EVar39;
      structName_04._M_string_length._4_4_ = in_stack_fffffffffffffbb4;
      structName_04.field_2._M_allocated_capacity._0_4_ = uVar40;
      structName_04.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffbbc;
      structName_04.field_2._8_4_ = uVar32;
      structName_04.field_2._12_4_ = in_stack_fffffffffffffbc4;
      TType::getCompleteString
                (&errmsg,(TType *)CONCAT44(extraout_var_x00136,iVar7),true,(bool)getQualifiers,bVar3
                 ,true,name_04,structName_04);
      TInfoSinkBase::append(&infoSink->info,&errmsg);
      TInfoSinkBase::append(&infoSink->info,"\"\n");
      TInfoSinkBase::append(&infoSink->info,"    ");
      pcVar20 = StageName(EVar23);
      TInfoSinkBase::append(&infoSink->info,pcVar20);
      TInfoSinkBase::append(&infoSink->info," stage: \"");
      pTVar24 = pTVar33;
      iVar7 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar33);
      iVar22 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar33);
      local_210 = GetThreadPoolAllocator();
      lVar30 = *(long *)(CONCAT44(extraout_var_x00139,iVar22) + 8);
      local_208 = local_1f8;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *
                          )&local_210,lVar30,
                          *(long *)(CONCAT44(extraout_var_x00139,iVar22) + 0x10) + lVar30);
      local_238 = GetThreadPoolAllocator();
      local_230 = local_220;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_238,"");
      name_05._M_dataplus._M_p = (pointer)&local_238;
      name_05._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_210;
      name_05._16_12_ = in_stack_fffffffffffffb88;
      name_05.field_2._M_allocated_capacity._4_4_ = EVar23;
      name_05.field_2._8_4_ = uVar34;
      name_05.field_2._12_4_ = uVar10;
      structName_05._M_dataplus._M_p = (pointer)pTVar24;
      structName_05._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)this;
      structName_05._M_string_length._0_4_ = EVar39;
      structName_05._M_string_length._4_4_ = in_stack_fffffffffffffbb4;
      structName_05.field_2._M_allocated_capacity._0_4_ = uVar40;
      structName_05.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffbbc;
      structName_05.field_2._8_4_ = uVar32;
      structName_05.field_2._12_4_ = in_stack_fffffffffffffbc4;
      TType::getCompleteString
                (&errmsg,(TType *)CONCAT44(extraout_var_x00138,iVar7),true,SUB41(uVar34,0),bVar3,
                 true,name_05,structName_05);
    }
  }
  TInfoSinkBase::append(&infoSink->info,&errmsg);
  pcVar20 = "\"\n";
LAB_0036a9f7:
  TInfoSinkBase::append(&infoSink->info,pcVar20);
  return;
LAB_00368df7:
  iVar22 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  plVar11 = (long *)CONCAT44(extraout_var_30,iVar22);
  cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
  if (cVar5 == '\0') goto LAB_0036ae1b;
  uVar12 = (**(code **)(**(long **)(*(long *)(plVar11[0xd] + 8) + lVar30) + 0x50))();
  uVar10 = (undefined4)uVar12;
  in_stack_fffffffffffffbc4 = (undefined4)((ulong)uVar12 >> 0x20);
  iVar22 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar33);
  plVar11 = (long *)CONCAT44(extraout_var_31,iVar22);
  cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
  if (cVar5 == '\0') goto LAB_0036ae1b;
  lVar13 = (**(code **)(**(long **)(*(long *)(plVar11[0xd] + 8) + lVar28) + 0x50))();
  lVar19 = CONCAT44(in_stack_fffffffffffffbc4,uVar10);
  uVar21 = *(ulong *)(lVar13 + 8) ^ *(ulong *)(lVar19 + 8);
  cVar5 = 0x1fffffffffffffff < uVar21;
  if (0x1fffffffffffffff < uVar21) {
    in_stack_fffffffffffffbb4 = CONCAT13(cVar5,(int3)in_stack_fffffffffffffbb4);
    error(this,infoSink,"Interface block member layout matrix qualifier must match:",EVar23);
    cVar5 = (char)((uint)in_stack_fffffffffffffbb4 >> 0x18);
    lVar19 = CONCAT44(in_stack_fffffffffffffbc4,uVar10);
  }
  if (*(int *)(lVar19 + 0x14) != *(int *)(lVar13 + 0x14)) {
    error(this,infoSink,"Interface block member layout offset qualifier must match:",EVar23);
    lVar19 = CONCAT44(in_stack_fffffffffffffbc4,uVar10);
    cVar5 = '\x01';
  }
  if (*(int *)(lVar19 + 0x18) != *(int *)(lVar13 + 0x18)) {
    error(this,infoSink,"Interface block member layout align qualifier must match:",EVar23);
    lVar19 = CONCAT44(in_stack_fffffffffffffbc4,uVar10);
    cVar5 = '\x01';
  }
  uVar21 = *(ulong *)(lVar13 + 0x1c) ^ *(ulong *)(lVar19 + 0x1c);
  if ((uVar21 & 0xfff) == 0) {
    if ((uVar21 & 0x7000) != 0) goto LAB_00368f59;
    if (cVar5 == '\0') goto LAB_003692a8;
  }
  else {
    error(this,infoSink,"Interface block member layout location qualifier must match:",EVar23);
    if (((*(uint *)(lVar13 + 0x1c) ^ *(uint *)(CONCAT44(in_stack_fffffffffffffbc4,uVar10) + 0x1c)) &
        0x7000) != 0) {
LAB_00368f59:
      error(this,infoSink,"Interface block member layout component qualifier must match:",EVar23);
    }
  }
  TInfoSinkBase::append(&infoSink->info,"    ");
  pcVar20 = StageName(stage);
  TInfoSinkBase::append(&infoSink->info,pcVar20);
  TInfoSinkBase::append(&infoSink->info," stage: Block: ");
  pTVar38 = pTVar24;
  iVar22 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
  pTVar14 = (TString *)
            (**(code **)(*(long *)CONCAT44(extraout_var_32,iVar22) + 0x28))
                      ((long *)CONCAT44(extraout_var_32,iVar22));
  TInfoSinkBase::append(&infoSink->info,pTVar14);
  TInfoSinkBase::append(&infoSink->info,", Member: ");
  iVar22 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar24);
  plVar11 = (long *)CONCAT44(extraout_var_33,iVar22);
  cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
  if (cVar5 == '\0') goto LAB_0036ae1b;
  pTVar14 = (TString *)(**(code **)(**(long **)(*(long *)(plVar11[0xd] + 8) + lVar30) + 0x30))();
  TInfoSinkBase::append(&infoSink->info,pTVar14);
  TInfoSinkBase::append(&infoSink->info," \"");
  iVar22 = (*(pTVar38->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  plVar11 = (long *)CONCAT44(extraout_var_34,iVar22);
  cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
  if (cVar5 == '\0') goto LAB_0036ae1b;
  uVar12 = *(undefined8 *)(*(long *)(plVar11[0xd] + 8) + lVar30);
  uVar10 = (undefined4)uVar12;
  in_stack_fffffffffffffbc4 = (undefined4)((ulong)uVar12 >> 0x20);
  local_3c8 = GetThreadPoolAllocator();
  local_3c0 = local_3b0;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_3c8,
             "","");
  local_378 = GetThreadPoolAllocator();
  local_370 = local_360;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_378,
             "","");
  name._M_dataplus._M_p = (pointer)&local_378;
  name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_3c8;
  name._16_12_ = in_stack_fffffffffffffb88;
  name.field_2._M_allocated_capacity._4_4_ = EVar23;
  name.field_2._8_4_ = (int)pTVar38;
  name.field_2._12_4_ = (int)((ulong)pTVar38 >> 0x20);
  structName._M_dataplus._M_p = (pointer)pTVar16;
  structName._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)this;
  structName._M_string_length._0_4_ = stage;
  structName._M_string_length._4_4_ = in_stack_fffffffffffffbb4;
  structName.field_2._M_allocated_capacity._0_4_ = iVar7;
  structName.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffbbc;
  structName.field_2._8_4_ = uVar10;
  structName.field_2._12_4_ = in_stack_fffffffffffffbc4;
  TType::getCompleteString
            (&errmsg,(TType *)CONCAT44(in_stack_fffffffffffffbc4,uVar10),true,true,false,false,name,
             structName);
  TInfoSinkBase::append(&infoSink->info,&errmsg);
  TInfoSinkBase::append(&infoSink->info,"\"\n");
  TInfoSinkBase::append(&infoSink->info,"    ");
  pcVar20 = StageName(EVar23);
  TInfoSinkBase::append(&infoSink->info,pcVar20);
  TInfoSinkBase::append(&infoSink->info," stage: Block: ");
  iVar22 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar33);
  pTVar14 = (TString *)
            (**(code **)(*(long *)CONCAT44(extraout_var_35,iVar22) + 0x28))
                      ((long *)CONCAT44(extraout_var_35,iVar22));
  TInfoSinkBase::append(&infoSink->info,pTVar14);
  TInfoSinkBase::append(&infoSink->info,", Member: ");
  iVar22 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar33);
  plVar11 = (long *)CONCAT44(extraout_var_36,iVar22);
  cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
  if (cVar5 == '\0') goto LAB_0036ae1b;
  pTVar14 = (TString *)(**(code **)(**(long **)(*(long *)(plVar11[0xd] + 8) + lVar28) + 0x30))();
  TInfoSinkBase::append(&infoSink->info,pTVar14);
  TInfoSinkBase::append(&infoSink->info," \"");
  iVar22 = (*(pTVar33->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar33);
  plVar11 = (long *)CONCAT44(extraout_var_37,iVar22);
  cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
  if (cVar5 == '\0') goto LAB_0036ae1b;
  pTVar17 = *(TType **)(*(long *)(plVar11[0xd] + 8) + lVar28);
  local_3f0 = GetThreadPoolAllocator();
  local_3e8 = local_3d8;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_3f0,
             "","");
  local_3a0 = GetThreadPoolAllocator();
  local_398 = local_388;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_3a0,
             "","");
  name_00._M_dataplus._M_p = (pointer)&local_3a0;
  name_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&local_3f0;
  name_00._16_12_ = in_stack_fffffffffffffb88;
  name_00.field_2._M_allocated_capacity._4_4_ = EVar23;
  name_00.field_2._8_4_ = (int)pTVar38;
  name_00.field_2._12_4_ = (int)((ulong)pTVar38 >> 0x20);
  structName_00._M_dataplus._M_p = (pointer)pTVar16;
  structName_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)this;
  structName_00._M_string_length._0_4_ = stage;
  structName_00._M_string_length._4_4_ = in_stack_fffffffffffffbb4;
  structName_00.field_2._M_allocated_capacity._0_4_ = iVar7;
  structName_00.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffbbc;
  structName_00.field_2._8_4_ = uVar10;
  structName_00.field_2._12_4_ = in_stack_fffffffffffffbc4;
  TType::getCompleteString(&errmsg,pTVar17,true,true,false,false,name_00,structName_00);
  TInfoSinkBase::append(&infoSink->info,&errmsg);
  TInfoSinkBase::append(&infoSink->info,"\"\n");
  local_42c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  pTVar24 = pTVar38;
LAB_003692a8:
  uVar32 = uVar32 + 1;
LAB_003692b6:
  iVar7 = iVar7 + 1;
  in_stack_fffffffffffffbbc = 0;
  iVar22 = (*(pTVar24->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
  plVar11 = (long *)CONCAT44(extraout_var_38,iVar22);
  pTVar38 = pTVar24;
  cVar5 = (**(code **)(*plVar11 + 0x128))(plVar11);
  if (cVar5 == '\0') goto LAB_0036ae1b;
  goto LAB_00368cde;
}

Assistant:

void TIntermediate::mergeErrorCheck(TInfoSink& infoSink, const TIntermSymbol& symbol, const TIntermSymbol& unitSymbol)
{
    EShLanguage stage = symbol.getStage();
    EShLanguage unitStage = unitSymbol.getStage();
    bool crossStage = stage != unitStage;
    bool writeTypeComparison = false;
    bool errorReported = false;
    bool printQualifiers = false;
    bool printPrecision = false;
    bool printType = false;

    // Types have to match
    {
        // but, we make an exception if one is an implicit array and the other is sized
        // or if the array sizes differ because of the extra array dimension on some in/out boundaries
        bool arraysMatch = false;
        if (isIoResizeArray(symbol.getType(), stage) || isIoResizeArray(unitSymbol.getType(), unitStage)) {
            // if the arrays have an extra dimension because of the stage.
            // compare dimensions while ignoring the outer dimension
            unsigned int firstDim = isIoResizeArray(symbol.getType(), stage) ? 1 : 0;
            unsigned int numDim = symbol.getArraySizes()
                ? symbol.getArraySizes()->getNumDims() : 0;
            unsigned int unitFirstDim = isIoResizeArray(unitSymbol.getType(), unitStage) ? 1 : 0;
            unsigned int unitNumDim = unitSymbol.getArraySizes()
                ? unitSymbol.getArraySizes()->getNumDims() : 0;
            arraysMatch = (numDim - firstDim) == (unitNumDim - unitFirstDim);
            // check that array sizes match as well
            for (unsigned int i = 0; i < (numDim - firstDim) && arraysMatch; i++) {
                if (symbol.getArraySizes()->getDimSize(firstDim + i) !=
                    unitSymbol.getArraySizes()->getDimSize(unitFirstDim + i)) {
                    arraysMatch = false;
                    break;
                }
            }
        }
        else {
            arraysMatch = symbol.getType().sameArrayness(unitSymbol.getType()) ||
                (symbol.getType().isArray() && unitSymbol.getType().isArray() &&
                 (symbol.getType().isImplicitlySizedArray() || unitSymbol.getType().isImplicitlySizedArray() ||
                  symbol.getType().isUnsizedArray() || unitSymbol.getType().isUnsizedArray()));
        }

        int lpidx = -1;
        int rpidx = -1;
        if (!symbol.getType().sameElementType(unitSymbol.getType(), &lpidx, &rpidx)) {
            if (lpidx >= 0 && rpidx >= 0) {
                error(infoSink, "Member names and types must match:", unitStage);
                infoSink.info << "    Block: " << symbol.getType().getTypeName() << "\n";
                infoSink.info << "        " << StageName(stage) << " stage: \""
                              << (*symbol.getType().getStruct())[lpidx].type->getCompleteString(true, false, false, true,
                                      (*symbol.getType().getStruct())[lpidx].type->getFieldName()) << "\"\n";
                infoSink.info << "        " << StageName(unitStage) << " stage: \""
                              << (*unitSymbol.getType().getStruct())[rpidx].type->getCompleteString(true, false, false, true,
                                      (*unitSymbol.getType().getStruct())[rpidx].type->getFieldName()) << "\"\n";
                errorReported = true;
            } else if (lpidx >= 0 && rpidx == -1) {
                  TString errmsg = StageName(stage);
                  errmsg.append(" block member has no corresponding member in ").append(StageName(unitStage)).append(" block:");
                  error(infoSink, errmsg.c_str(), unitStage);
                  infoSink.info << "    " << StageName(stage) << " stage: Block: " << symbol.getType().getTypeName() << ", Member: "
                    << (*symbol.getType().getStruct())[lpidx].type->getFieldName() << "\n";
                  infoSink.info << "    " << StageName(unitStage) << " stage: Block: " << unitSymbol.getType().getTypeName() << ", Member: n/a \n";
                  errorReported = true;
            } else if (lpidx == -1 && rpidx >= 0) {
                  TString errmsg = StageName(unitStage);
                  errmsg.append(" block member has no corresponding member in ").append(StageName(stage)).append(" block:");
                  error(infoSink, errmsg.c_str(), unitStage);
                  infoSink.info << "    " << StageName(unitStage) << " stage: Block: " << unitSymbol.getType().getTypeName() << ", Member: "
                    << (*unitSymbol.getType().getStruct())[rpidx].type->getFieldName() << "\n";
                  infoSink.info << "    " << StageName(stage) << " stage: Block: " << symbol.getType().getTypeName() << ", Member: n/a \n";
                  errorReported = true;
            } else {
                  error(infoSink, "Types must match:", unitStage);
                  writeTypeComparison = true;
                  printType = true;
            }
        } else if (!arraysMatch) {
            error(infoSink, "Array sizes must be compatible:", unitStage);
            writeTypeComparison = true;
            printType = true;
        } else if (!symbol.getType().sameTypeParameters(unitSymbol.getType())) {
            error(infoSink, "Type parameters must match:", unitStage);
            writeTypeComparison = true;
            printType = true;
        }
    }

    // Interface block  member-wise layout qualifiers have to match
    if (symbol.getType().getBasicType() == EbtBlock && unitSymbol.getType().getBasicType() == EbtBlock &&
        symbol.getType().getStruct() && unitSymbol.getType().getStruct() &&
        symbol.getType().sameStructType(unitSymbol.getType())) {
        unsigned int li = 0;
        unsigned int ri = 0;
        while (li < symbol.getType().getStruct()->size() && ri < unitSymbol.getType().getStruct()->size()) {
            if ((*symbol.getType().getStruct())[li].type->hiddenMember()) {
                ++li;
                continue;
            }
            if ((*unitSymbol.getType().getStruct())[ri].type->hiddenMember()) {
                ++ri;
                continue;
            }
            const TQualifier& qualifier = (*symbol.getType().getStruct())[li].type->getQualifier();
            const TQualifier & unitQualifier = (*unitSymbol.getType().getStruct())[ri].type->getQualifier();
            bool layoutQualifierError = false;
            if (qualifier.layoutMatrix != unitQualifier.layoutMatrix) {
                error(infoSink, "Interface block member layout matrix qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (qualifier.layoutOffset != unitQualifier.layoutOffset) {
                error(infoSink, "Interface block member layout offset qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (qualifier.layoutAlign != unitQualifier.layoutAlign) {
                error(infoSink, "Interface block member layout align qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (qualifier.layoutLocation != unitQualifier.layoutLocation) {
                error(infoSink, "Interface block member layout location qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (qualifier.layoutComponent != unitQualifier.layoutComponent) {
                error(infoSink, "Interface block member layout component qualifier must match:", unitStage);
                layoutQualifierError = true;
            }
            if (layoutQualifierError) {
                infoSink.info << "    " << StageName(stage) << " stage: Block: " << symbol.getType().getTypeName() << ", Member: "
                              << (*symbol.getType().getStruct())[li].type->getFieldName() << " \""
                              << (*symbol.getType().getStruct())[li].type->getCompleteString(true, true, false, false) << "\"\n";
                infoSink.info << "    " << StageName(unitStage) << " stage: Block: " << unitSymbol.getType().getTypeName() << ", Member: "
                              << (*unitSymbol.getType().getStruct())[ri].type->getFieldName() << " \""
                              << (*unitSymbol.getType().getStruct())[ri].type->getCompleteString(true, true, false, false) << "\"\n";
                errorReported = true;
            }
            ++li;
            ++ri;
        }
    }

    bool isInOut = crossStage &&
                   ((symbol.getQualifier().storage == EvqVaryingIn && unitSymbol.getQualifier().storage == EvqVaryingOut) ||
                   (symbol.getQualifier().storage == EvqVaryingOut && unitSymbol.getQualifier().storage == EvqVaryingIn));

    // Qualifiers have to (almost) match
    // Storage...
    if (!isInOut && symbol.getQualifier().storage != unitSymbol.getQualifier().storage) {
        error(infoSink, "Storage qualifiers must match:", unitStage);
        writeTypeComparison = true;
        printQualifiers = true;
    }

    // Uniform and buffer blocks must either both have an instance name, or
    // must both be anonymous. The names don't need to match though.
    if (symbol.getQualifier().isUniformOrBuffer() &&
        (IsAnonymous(symbol.getName()) != IsAnonymous(unitSymbol.getName()))) {
        error(infoSink, "Matched Uniform or Storage blocks must all be anonymous,"
                        " or all be named:", unitStage);
        writeTypeComparison = true;
    }

    if (symbol.getQualifier().storage == unitSymbol.getQualifier().storage &&
        (IsAnonymous(symbol.getName()) != IsAnonymous(unitSymbol.getName()) ||
         (!IsAnonymous(symbol.getName()) && symbol.getName() != unitSymbol.getName()))) {
        warn(infoSink, "Matched shader interfaces are using different instance names.", unitStage);
        writeTypeComparison = true;
    }

    // Precision...
    if (!isInOut && symbol.getQualifier().precision != unitSymbol.getQualifier().precision) {
        error(infoSink, "Precision qualifiers must match:", unitStage);
        writeTypeComparison = true;
        printPrecision = true;
    }

    // Invariance...
    if (! crossStage && symbol.getQualifier().invariant != unitSymbol.getQualifier().invariant) {
        error(infoSink, "Presence of invariant qualifier must match:", unitStage);
        writeTypeComparison = true;
        printQualifiers = true;
    }

    // Precise...
    if (! crossStage && symbol.getQualifier().isNoContraction() != unitSymbol.getQualifier().isNoContraction()) {
        error(infoSink, "Presence of precise qualifier must match:", unitStage);
        writeTypeComparison = true;
        printPrecision = true;
    }

    // Auxiliary and interpolation...
    // "interpolation qualification (e.g., flat) and auxiliary qualification (e.g. centroid) may differ.
    //  These mismatches are allowed between any pair of stages ...
    //  those provided in the fragment shader supersede those provided in previous stages."
    if (!crossStage &&
        (symbol.getQualifier().centroid  != unitSymbol.getQualifier().centroid ||
        symbol.getQualifier().smooth    != unitSymbol.getQualifier().smooth ||
        symbol.getQualifier().flat      != unitSymbol.getQualifier().flat ||
        symbol.getQualifier().isSample()!= unitSymbol.getQualifier().isSample() ||
        symbol.getQualifier().isPatch() != unitSymbol.getQualifier().isPatch() ||
        symbol.getQualifier().isNonPerspective() != unitSymbol.getQualifier().isNonPerspective())) {
        error(infoSink, "Interpolation and auxiliary storage qualifiers must match:", unitStage);
        writeTypeComparison = true;
        printQualifiers = true;
    }

    // Memory...
    bool memoryQualifierError = false;
    if (symbol.getQualifier().coherent != unitSymbol.getQualifier().coherent) {
        error(infoSink, "Memory coherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().devicecoherent != unitSymbol.getQualifier().devicecoherent) {
        error(infoSink, "Memory devicecoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().queuefamilycoherent != unitSymbol.getQualifier().queuefamilycoherent) {
        error(infoSink, "Memory queuefamilycoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().workgroupcoherent != unitSymbol.getQualifier().workgroupcoherent) {
        error(infoSink, "Memory workgroupcoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().subgroupcoherent != unitSymbol.getQualifier().subgroupcoherent) {
        error(infoSink, "Memory subgroupcoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().shadercallcoherent != unitSymbol.getQualifier().shadercallcoherent) {
        error(infoSink, "Memory shadercallcoherent qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().nonprivate != unitSymbol.getQualifier().nonprivate) {
        error(infoSink, "Memory nonprivate qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().volatil != unitSymbol.getQualifier().volatil) {
        error(infoSink, "Memory volatil qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().nontemporal != unitSymbol.getQualifier().nontemporal) {
        error(infoSink, "Memory nontemporal qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().restrict != unitSymbol.getQualifier().restrict) {
        error(infoSink, "Memory restrict qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().readonly != unitSymbol.getQualifier().readonly) {
        error(infoSink, "Memory readonly qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (symbol.getQualifier().writeonly != unitSymbol.getQualifier().writeonly) {
        error(infoSink, "Memory writeonly qualifier must match:", unitStage);
        memoryQualifierError = true;
    }
    if (memoryQualifierError) {
          writeTypeComparison = true;
          printQualifiers = true;
    }

    // Layouts...
    // TODO: 4.4 enhanced layouts: Generalize to include offset/align: current spec
    //       requires separate user-supplied offset from actual computed offset, but
    //       current implementation only has one offset.
    bool layoutQualifierError = false;
    if (symbol.getQualifier().layoutMatrix != unitSymbol.getQualifier().layoutMatrix) {
        error(infoSink, "Layout matrix qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().layoutPacking != unitSymbol.getQualifier().layoutPacking) {
        error(infoSink, "Layout packing qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().hasLocation() && unitSymbol.getQualifier().hasLocation() && symbol.getQualifier().layoutLocation != unitSymbol.getQualifier().layoutLocation) {
        error(infoSink, "Layout location qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().layoutComponent != unitSymbol.getQualifier().layoutComponent) {
        error(infoSink, "Layout component qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().layoutIndex != unitSymbol.getQualifier().layoutIndex) {
        error(infoSink, "Layout index qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().hasBinding() && unitSymbol.getQualifier().hasBinding() && symbol.getQualifier().layoutBinding != unitSymbol.getQualifier().layoutBinding) {
        error(infoSink, "Layout binding qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (symbol.getQualifier().hasBinding() && (symbol.getQualifier().layoutOffset != unitSymbol.getQualifier().layoutOffset)) {
        error(infoSink, "Layout offset qualifier must match:", unitStage);
        layoutQualifierError = true;
    }
    if (layoutQualifierError) {
        writeTypeComparison = true;
        printQualifiers = true;
    }

    // Initializers have to match, if both are present, and if we don't already know the types don't match
    if (! writeTypeComparison && ! errorReported) {
        if (! symbol.getConstArray().empty() && ! unitSymbol.getConstArray().empty()) {
            if (symbol.getConstArray() != unitSymbol.getConstArray()) {
                error(infoSink, "Initializers must match:", unitStage);
                infoSink.info << "    " << symbol.getName() << "\n";
            }
        }
    }

    if (writeTypeComparison) {
        if (symbol.getType().getBasicType() == EbtBlock && unitSymbol.getType().getBasicType() == EbtBlock &&
            symbol.getType().getStruct() && unitSymbol.getType().getStruct()) {
          if (printType) {
            infoSink.info << "    " << StageName(stage) << " stage: \"" << symbol.getType().getCompleteString(true, printQualifiers, printPrecision,
                                                    printType, symbol.getName(), symbol.getType().getTypeName()) << "\"\n";
            infoSink.info << "    " << StageName(unitStage) << " stage: \"" << unitSymbol.getType().getCompleteString(true, printQualifiers, printPrecision,
                                                    printType, unitSymbol.getName(), unitSymbol.getType().getTypeName()) << "\"\n";
          } else {
            infoSink.info << "    " << StageName(stage) << " stage: Block: " << symbol.getType().getTypeName() << " Instance: " << symbol.getName()
              << ": \"" << symbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType) << "\"\n";
            infoSink.info << "    " << StageName(unitStage) << " stage: Block: " << unitSymbol.getType().getTypeName() << " Instance: " << unitSymbol.getName()
              << ": \"" << unitSymbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType) << "\"\n";
          }
        } else {
          if (printType) {
            infoSink.info << "    " << StageName(stage) << " stage: \""
              << symbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType, symbol.getName()) << "\"\n";
            infoSink.info << "    " << StageName(unitStage) << " stage: \""
              << unitSymbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType, unitSymbol.getName()) << "\"\n";
          } else {
            infoSink.info << "    " << StageName(stage) << " stage: " << symbol.getName() << " \""
              << symbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType) << "\"\n";
            infoSink.info << "    " << StageName(unitStage) << " stage: " << unitSymbol.getName() << " \""
              << unitSymbol.getType().getCompleteString(true, printQualifiers, printPrecision, printType) << "\"\n";
          }
        }
    }
}